

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cc
# Opt level: O0

statemachine_ctx *
ctemplate_htmlparser::statemachine_duplicate
          (statemachine_ctx *src,statemachine_definition *def,void *user)

{
  statemachine_ctx *dst;
  void *user_local;
  statemachine_definition *def_local;
  statemachine_ctx *src_local;
  
  if (src != (statemachine_ctx *)0x0) {
    src_local = statemachine_new(def,user);
    if (src_local == (statemachine_ctx *)0x0) {
      src_local = (statemachine_ctx *)0x0;
    }
    else {
      statemachine_copy(src_local,src,def,user);
    }
    return src_local;
  }
  __assert_fail("src != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/statemachine.cc"
                ,0x10a,
                "statemachine_ctx *ctemplate_htmlparser::statemachine_duplicate(statemachine_ctx *, statemachine_definition *, void *)"
               );
}

Assistant:

statemachine_ctx *statemachine_duplicate(statemachine_ctx *src,
                                         statemachine_definition *def,
                                         void *user)
{
    statemachine_ctx *dst;
    assert(src != NULL);
    dst = statemachine_new(def, user);
    if (dst == NULL)
      return NULL;

    statemachine_copy(dst, src, def, user);

    return dst;
}